

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

tuple<int,_int> __thiscall
libtorrent::http_parser::incoming(http_parser *this,span<const_char> recv_buffer,bool *error)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  index_type iVar5;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  ulong uVar7;
  longlong lVar8;
  long lVar9;
  long lVar10;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var11;
  int iVar12;
  http_parser *this_00;
  char *in_R8;
  int64_t payload_received;
  long local_2d0;
  undefined1 local_2c8 [8];
  pair<long,_long> chunk_range;
  int local_2a4;
  long lStack_2a0;
  int header_size;
  int64_t chunk_size;
  undefined1 local_288 [8];
  span<const_char> buf;
  int64_t payload;
  int incoming_1;
  char *end;
  char *ptr;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_iterator>
  _Stack_250;
  bool success;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined1 local_208 [8];
  string value;
  undefined1 local_1c8 [8];
  string name;
  ulong local_1a0;
  size_type separator;
  char *line_end_1;
  string line_1;
  char *local_168;
  char *newline_1;
  string local_140;
  char *local_120;
  char *local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  int local_6c;
  char *pcStack_68;
  int incoming;
  char *line;
  char *line_end;
  char *local_50;
  char *newline;
  char *pos;
  ptrdiff_t start_pos;
  char *local_30;
  bool *error_local;
  http_parser *this_local;
  span<const_char> recv_buffer_local;
  tuple<int,_int> *ret;
  
  this_local = (http_parser *)recv_buffer.m_len;
  this_00 = (http_parser *)recv_buffer.m_ptr;
  start_pos._4_4_ = 0;
  start_pos._0_4_ = 0;
  local_30 = in_R8;
  error_local = (bool *)this_00;
  recv_buffer_local.m_ptr = error;
  recv_buffer_local.m_len = (difference_type)this;
  std::tuple<int,_int>::tuple<int,_int,_true>
            ((tuple<int,_int> *)this,(int *)((long)&start_pos + 4),(int *)&start_pos);
  pcVar3 = (char *)span<const_char>::size(&this_00->m_recv_buffer);
  pos = pcVar3;
  pcVar4 = (char *)span<const_char>::size((span<const_char> *)&this_local);
  if (pcVar3 != pcVar4) {
    (this_00->m_recv_buffer).m_ptr = (char *)this_local;
    (this_00->m_recv_buffer).m_len = (difference_type)recv_buffer_local.m_ptr;
    if (this_00->m_state == error_state) {
      *local_30 = '\x01';
    }
    else {
      pcVar3 = span<const_char>::data((span<const_char> *)&this_local);
      newline = pcVar3 + this_00->m_recv_pos;
      do {
        pcVar3 = newline;
        if (this_00->m_state == read_status) {
          pcVar4 = span<const_char>::end((span<const_char> *)&this_local);
          line_end._7_1_ = 10;
          pcVar3 = std::find<char_const*,char>(pcVar3,pcVar4,(char *)((long)&line_end + 7));
          local_50 = pcVar3;
          pcVar4 = span<const_char>::end((span<const_char> *)&this_local);
          if (pcVar3 == pcVar4) {
            iVar5 = span<const_char>::size(&this_00->m_recv_buffer);
            iVar2 = (int)pos;
            p_Var6 = std::get<1ul,int,int>((tuple<int,_int> *)this);
            *p_Var6 = ((int)iVar5 - iVar2) + *p_Var6;
            return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
          }
          if (local_50 == newline) {
            this_00->m_state = error_state;
            *local_30 = '\x01';
            return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
          }
          line = local_50;
          if ((newline != local_50) && (local_50[-1] == '\r')) {
            line = local_50 + -1;
          }
          pcStack_68 = newline;
          local_50 = local_50 + 1;
          iVar2 = (int)local_50;
          local_6c = (int)local_50 - (int)newline;
          this_00->m_recv_pos = this_00->m_recv_pos + (long)local_6c;
          pcVar3 = span<const_char>::data(&this_00->m_recv_buffer);
          iVar12 = (int)pcVar3 + (int)pos;
          p_Var6 = std::get<1ul,int,int>((tuple<int,_int> *)this);
          *p_Var6 = *p_Var6 + (iVar2 - iVar12);
          newline = local_50;
          read_until_abi_cxx11_
                    (&local_90,(libtorrent *)&stack0xffffffffffffff98,(char **)0x20,(char)line,in_R8
                    );
          std::__cxx11::string::operator=((string *)&this_00->m_protocol,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&this_00->m_protocol);
          bVar1 = std::operator==(&local_b0,"HTTP/");
          std::__cxx11::string::~string((string *)&local_b0);
          if (bVar1) {
            read_until_abi_cxx11_
                      (&local_e0,(libtorrent *)&stack0xffffffffffffff98,(char **)0x20,(char)line,
                       in_R8);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            iVar2 = atoi(pcVar3);
            this_00->m_status_code = iVar2;
            std::__cxx11::string::~string((string *)&local_e0);
            read_until_abi_cxx11_
                      (&local_100,(libtorrent *)&stack0xffffffffffffff98,(char **)0xd,(char)line,
                       in_R8);
            std::__cxx11::string::operator=
                      ((string *)&this_00->m_server_message,(string *)&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            bVar1 = std::operator==(&this_00->m_protocol,"HTTP/1.0");
            if (bVar1) {
              this_00->m_connection_close = true;
            }
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)&this_00->m_method,(string *)&this_00->m_protocol);
            local_108._M_current = (char *)std::__cxx11::string::begin();
            local_110._M_current = (char *)std::__cxx11::string::end();
            local_118 = (char *)std::__cxx11::string::begin();
            local_120 = (char *)std::
                                transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                                          (local_108,local_110,
                                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            )local_118,to_lower);
            this_00->m_content_length = 0;
            std::__cxx11::string::clear();
            read_until_abi_cxx11_
                      (&local_140,(libtorrent *)&stack0xffffffffffffff98,(char **)0x20,(char)line,
                       in_R8);
            std::__cxx11::string::operator=((string *)&this_00->m_path,(string *)&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            read_until_abi_cxx11_
                      ((string *)&newline_1,(libtorrent *)&stack0xffffffffffffff98,(char **)0x20,
                       (char)line,in_R8);
            std::__cxx11::string::operator=((string *)&this_00->m_protocol,(string *)&newline_1);
            std::__cxx11::string::~string((string *)&newline_1);
            this_00->m_status_code = 0;
          }
          pcVar3 = newline;
          this_00->m_state = read_header;
          pcVar4 = span<const_char>::data((span<const_char> *)&this_local);
          pos = pcVar3 + -(long)pcVar4;
        }
        pcVar3 = newline;
        if (this_00->m_state != read_header) {
LAB_002eb7c0:
          if (this_00->m_state != read_body) {
            return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
          }
          pcVar3 = span<const_char>::end((span<const_char> *)&this_local);
          payload._0_4_ = (int)pcVar3 - (int)newline;
          if (((this_00->m_chunked_encoding & 1U) == 0) || ((this_00->m_flags & 1U) != 0)) {
            if ((this_00->m_content_length <
                 (this_00->m_recv_pos - (long)this_00->m_body_start_pos) + (long)(int)payload) &&
               (-1 < this_00->m_content_length)) {
              payload._0_4_ =
                   ((int)this_00->m_content_length - (int)this_00->m_recv_pos) +
                   this_00->m_body_start_pos;
            }
            iVar2 = (int)payload;
            this_00->m_recv_pos = (long)(int)payload + this_00->m_recv_pos;
            p_Var11 = std::get<0ul,int,int>((tuple<int,_int> *)this);
            *p_Var11 = iVar2 + *p_Var11;
          }
          else {
            if (this_00->m_cur_chunk_end == -1) {
              this_00->m_cur_chunk_end = (long)this_00->m_body_start_pos;
            }
            while( true ) {
              iVar2 = (int)payload;
              bVar1 = false;
              if ((this_00->m_cur_chunk_end <= this_00->m_recv_pos + (long)(int)payload) &&
                 (bVar1 = false, (this_00->m_finished & 1U) == 0)) {
                bVar1 = 0 < (int)payload;
              }
              if (!bVar1) break;
              buf.m_len = this_00->m_cur_chunk_end - this_00->m_recv_pos;
              if (0 < buf.m_len) {
                this_00->m_recv_pos = buf.m_len + this_00->m_recv_pos;
                iVar2 = (int)buf.m_len;
                p_Var11 = std::get<0ul,int,int>((tuple<int,_int> *)this);
                *p_Var11 = iVar2 + *p_Var11;
                payload._0_4_ = (int)payload - (int)buf.m_len;
              }
              span<char_const>::span<libtorrent::span<char_const>,char_const,void>
                        ((span<char_const> *)&chunk_size,(span<const_char> *)&this_local);
              lVar9 = libtorrent::aux::numeric_cast<long,long,void>(this_00->m_cur_chunk_end);
              _local_288 = span<const_char>::subspan((span<const_char> *)&chunk_size,lVar9);
              chunk_range.second = (long)local_288;
              bVar1 = parse_chunk_header(this_00,_local_288,&stack0xfffffffffffffd60,&local_2a4);
              lVar9 = lStack_2a0;
              if (bVar1) {
                if ((lStack_2a0 < 0) ||
                   (lVar10 = std::numeric_limits<long>::max(),
                   (lVar10 - this_00->m_cur_chunk_end) - (long)local_2a4 < lVar9)) {
                  this_00->m_state = error_state;
                  *local_30 = '\x01';
                  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
                }
                if (0 < lStack_2a0) {
                  local_2d0 = this_00->m_cur_chunk_end + (long)local_2a4;
                  payload_received = this_00->m_cur_chunk_end + (long)local_2a4 + lStack_2a0;
                  std::pair<long,_long>::pair<long,_long,_true>
                            ((pair<long,_long> *)local_2c8,&local_2d0,&payload_received);
                  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
                  push_back(&this_00->m_chunked_ranges,(value_type *)local_2c8);
                }
                this_00->m_cur_chunk_end = local_2a4 + lStack_2a0 + this_00->m_cur_chunk_end;
                if (lStack_2a0 == 0) {
                  this_00->m_finished = true;
                }
                local_2a4 = local_2a4 - this_00->m_partial_chunk_header;
                this_00->m_partial_chunk_header = 0;
              }
              else {
                this_00->m_partial_chunk_header = (int)payload + this_00->m_partial_chunk_header;
                local_2a4 = (int)payload;
              }
              iVar2 = local_2a4;
              this_00->m_chunk_header_size = local_2a4 + this_00->m_chunk_header_size;
              this_00->m_recv_pos = (long)local_2a4 + this_00->m_recv_pos;
              p_Var6 = std::get<1ul,int,int>((tuple<int,_int> *)this);
              *p_Var6 = iVar2 + *p_Var6;
              payload._0_4_ = (int)payload - local_2a4;
            }
            if (0 < (int)payload) {
              this_00->m_recv_pos = (long)(int)payload + this_00->m_recv_pos;
              p_Var11 = std::get<0ul,int,int>((tuple<int,_int> *)this);
              *p_Var11 = iVar2 + *p_Var11;
            }
          }
          if (this_00->m_content_length < 0) {
            return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
          }
          if ((this_00->m_chunked_encoding & 1U) != 0) {
            return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
          }
          if (this_00->m_recv_pos - (long)this_00->m_body_start_pos < this_00->m_content_length) {
            return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
          }
          this_00->m_finished = true;
          return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
        }
        pcVar4 = span<const_char>::end((span<const_char> *)&this_local);
        line_1.field_2._M_local_buf[0xf] = '\n';
        local_168 = std::find<char_const*,char>(pcVar3,pcVar4,line_1.field_2._M_local_buf + 0xf);
        std::__cxx11::string::string((string *)&line_end_1);
        do {
          pcVar3 = span<const_char>::end((span<const_char> *)&this_local);
          bVar1 = false;
          if (local_168 != pcVar3) {
            bVar1 = this_00->m_state == read_header;
          }
          if (!bVar1) {
LAB_002eb721:
            pcVar3 = span<const_char>::data(&this_00->m_recv_buffer);
            iVar2 = (int)pos;
            p_Var6 = std::get<1ul,int,int>((tuple<int,_int> *)this);
            *p_Var6 = ((int)local_168 - ((int)pcVar3 + iVar2)) + *p_Var6;
            name.field_2._12_4_ = 0;
            break;
          }
          separator = (size_type)local_168;
          if ((newline != local_168) && (local_168[-1] == '\r')) {
            separator = (size_type)(local_168 + -1);
          }
          std::__cxx11::string::assign<char_const*,void>
                    ((string *)&line_end_1,newline,(char *)separator);
          local_168 = local_168 + 1;
          this_00->m_recv_pos = (int64_t)(local_168 + (this_00->m_recv_pos - (long)newline));
          newline = local_168;
          local_1a0 = std::__cxx11::string::find((char)&line_end_1,0x3a);
          if (local_1a0 == 0xffffffffffffffff) {
            if (this_00->m_status_code != 100) {
              this_00->m_state = read_body;
              this_00->m_body_start_pos = (int)this_00->m_recv_pos;
              goto LAB_002eb721;
            }
            this_00->m_state = read_status;
            name.field_2._12_4_ = 4;
            break;
          }
          std::__cxx11::string::substr((ulong)local_1c8,(ulong)&line_end_1);
          __first._M_current = (char *)std::__cxx11::string::begin();
          __last._M_current = (char *)std::__cxx11::string::end();
          __result._M_current = (char *)std::__cxx11::string::begin();
          value.field_2._8_8_ =
               std::
               transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                         (__first,__last,__result,to_lower);
          do {
            local_1a0 = local_1a0 + 1;
            uVar7 = std::__cxx11::string::size();
            bVar1 = false;
            if (local_1a0 < uVar7) {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&line_end_1);
              bVar1 = true;
              if (*pcVar3 != ' ') {
                pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&line_end_1);
                bVar1 = *pcVar3 == '\t';
              }
            }
          } while (bVar1);
          std::__cxx11::string::substr((ulong)local_208,(ulong)&line_end_1);
          std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                    (&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
          ;
          _Stack_250 = std::
                       multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                 ((multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                   *)&this_00->m_header,&local_248);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_248);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1c8,"content-length");
          if (bVar1) {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            lVar8 = strtoll(pcVar3,(char **)0x0,10);
            this_00->m_content_length = lVar8;
            if ((this_00->m_content_length < 0) ||
               (lVar9 = this_00->m_content_length, lVar10 = std::numeric_limits<long>::max(),
               lVar9 == lVar10)) {
              this_00->m_state = error_state;
              *local_30 = '\x01';
              name.field_2._12_4_ = 1;
              goto LAB_002eb6db;
            }
LAB_002eb67d:
            pcVar3 = newline;
            pcVar4 = span<const_char>::end((span<const_char> *)&this_local);
            payload._7_1_ = 10;
            local_168 = std::find<char_const*,char>(pcVar3,pcVar4,(char *)((long)&payload + 7));
            name.field_2._12_4_ = 0;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1c8,"connection");
            if (bVar1) {
              pcVar3 = (char *)std::__cxx11::string::c_str();
              bVar1 = string_begins_no_case("close",pcVar3);
              this_00->m_connection_close = bVar1;
              goto LAB_002eb67d;
            }
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1c8,"content-range");
            if (!bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1c8,"transfer-encoding");
              if (bVar1) {
                pcVar3 = (char *)std::__cxx11::string::c_str();
                bVar1 = string_begins_no_case("chunked",pcVar3);
                this_00->m_chunked_encoding = bVar1;
              }
              goto LAB_002eb67d;
            }
            ptr._7_1_ = 1;
            end = (char *)std::__cxx11::string::c_str();
            bVar1 = string_begins_no_case("bytes ",end);
            if (bVar1) {
              end = end + 6;
            }
            lVar8 = strtoll(end,(char **)&incoming_1,10);
            this_00->m_range_start = lVar8;
            if ((this_00->m_range_start < 0) ||
               (lVar9 = this_00->m_range_start, lVar10 = std::numeric_limits<long>::max(),
               lVar9 == lVar10)) {
              this_00->m_state = error_state;
              *local_30 = '\x01';
              name.field_2._12_4_ = 1;
            }
            else {
              if (_incoming_1 == end) {
                ptr._7_1_ = 0;
              }
              else if (*_incoming_1 == '-') {
                end = _incoming_1 + 1;
                lVar8 = strtoll(end,(char **)&incoming_1,10);
                this_00->m_range_end = lVar8;
                if ((this_00->m_range_end < 0) ||
                   (lVar9 = this_00->m_range_end, lVar10 = std::numeric_limits<long>::max(),
                   lVar9 == lVar10)) {
                  this_00->m_state = error_state;
                  *local_30 = '\x01';
                  name.field_2._12_4_ = 1;
                  goto LAB_002eb6db;
                }
                if (_incoming_1 == end) {
                  ptr._7_1_ = 0;
                }
              }
              else {
                ptr._7_1_ = 0;
              }
              if (((ptr._7_1_ & 1) != 0) && (this_00->m_range_start <= this_00->m_range_end)) {
                this_00->m_content_length = (this_00->m_range_end - this_00->m_range_start) + 1;
                goto LAB_002eb67d;
              }
              this_00->m_state = error_state;
              *local_30 = '\x01';
              name.field_2._12_4_ = 1;
            }
          }
LAB_002eb6db:
          std::__cxx11::string::~string((string *)local_208);
          std::__cxx11::string::~string((string *)local_1c8);
        } while (name.field_2._12_4_ == 0);
        std::__cxx11::string::~string((string *)&line_end_1);
        if (name.field_2._12_4_ == 0) goto LAB_002eb7c0;
      } while (name.field_2._12_4_ != 1);
    }
  }
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> http_parser::incoming(
		span<char const> recv_buffer, bool& error)
	{
		TORRENT_ASSERT(recv_buffer.size() >= m_recv_buffer.size());
		std::tuple<int, int> ret(0, 0);
		std::ptrdiff_t start_pos = m_recv_buffer.size();

		// early exit if there's nothing new in the receive buffer
		if (start_pos == recv_buffer.size()) return ret;
		m_recv_buffer = recv_buffer;

		if (m_state == error_state)
		{
			error = true;
			return ret;
		}

		char const* pos = recv_buffer.data() + m_recv_pos;

restart_response:

		if (m_state == read_status)
		{
			TORRENT_ASSERT(!m_finished);
			TORRENT_ASSERT(pos <= recv_buffer.end());
			char const* newline = std::find(pos, recv_buffer.end(), '\n');
			// if we don't have a full line yet, wait.
			if (newline == recv_buffer.end())
			{
				std::get<1>(ret) += int(m_recv_buffer.size() - start_pos);
				return ret;
			}

			if (newline == pos)
			{
				m_state = error_state;
				error = true;
				return ret;
			}

			char const* line_end = newline;
			if (pos != line_end && *(line_end - 1) == '\r') --line_end;

			char const* line = pos;
			++newline;
			TORRENT_ASSERT(newline >= pos);
			int incoming = int(newline - pos);
			m_recv_pos += incoming;
			std::get<1>(ret) += int(newline - (m_recv_buffer.data() + start_pos));
			pos = newline;

			m_protocol = read_until(line, ' ', line_end);
			if (m_protocol.substr(0, 5) == "HTTP/")
			{
				m_status_code = atoi(read_until(line, ' ', line_end).c_str());
				m_server_message = read_until(line, '\r', line_end);

				// HTTP 1.0 always closes the connection after
				// each request
				if (m_protocol == "HTTP/1.0") m_connection_close = true;
			}
			else
			{
				m_method = m_protocol;
				std::transform(m_method.begin(), m_method.end(), m_method.begin(), &to_lower);
				// the content length is assumed to be 0 for requests
				m_content_length = 0;
				m_protocol.clear();
				m_path = read_until(line, ' ', line_end);
				m_protocol = read_until(line, ' ', line_end);
				m_status_code = 0;
			}
			m_state = read_header;
			start_pos = pos - recv_buffer.data();
		}

		if (m_state == read_header)
		{
			TORRENT_ASSERT(!m_finished);
			TORRENT_ASSERT(pos <= recv_buffer.end());
			char const* newline = std::find(pos, recv_buffer.end(), '\n');
			std::string line;

			while (newline != recv_buffer.end() && m_state == read_header)
			{
				// if the LF character is preceded by a CR
				// character, don't copy it into the line string.
				char const* line_end = newline;
				if (pos != line_end && *(line_end - 1) == '\r') --line_end;
				line.assign(pos, line_end);
				++newline;
				m_recv_pos += newline - pos;
				pos = newline;

				std::string::size_type separator = line.find(':');
				if (separator == std::string::npos)
				{
					if (m_status_code == 100)
					{
						// for 100 Continue, we need to read another response header
						// before reading the body
						m_state = read_status;
						goto restart_response;
					}
					// this means we got a blank line,
					// the header is finished and the body
					// starts.
					m_state = read_body;
					// if this is a request (not a response)
					// we're done once we reach the end of the headers
//					if (!m_method.empty()) m_finished = true;
					// the HTTP header should always be < 2 GB
					TORRENT_ASSERT(m_recv_pos < std::numeric_limits<int>::max());
					m_body_start_pos = int(m_recv_pos);
					break;
				}

				std::string name = line.substr(0, separator);
				std::transform(name.begin(), name.end(), name.begin(), &to_lower);
				++separator;
				// skip whitespace
				while (separator < line.size()
					&& (line[separator] == ' ' || line[separator] == '\t'))
					++separator;
				std::string value = line.substr(separator, std::string::npos);
				m_header.insert(std::make_pair(name, value));

				if (name == "content-length")
				{
					m_content_length = std::strtoll(value.c_str(), nullptr, 10);
					if (m_content_length < 0
						|| m_content_length == std::numeric_limits<std::int64_t>::max())
					{
						m_state = error_state;
						error = true;
						return ret;
					}
				}
				else if (name == "connection")
				{
					m_connection_close = string_begins_no_case("close", value.c_str());
				}
				else if (name == "content-range")
				{
					bool success = true;
					char const* ptr = value.c_str();

					// apparently some web servers do not send the "bytes"
					// in their content-range. Don't treat it as an error
					// if we can't find it, just assume the byte counters
					// start immediately
					if (string_begins_no_case("bytes ", ptr)) ptr += 6;
					char* end;
					m_range_start = std::strtoll(ptr, &end, 10);
					if (m_range_start < 0
						|| m_range_start == std::numeric_limits<std::int64_t>::max())
					{
						m_state = error_state;
						error = true;
						return ret;
					}
					if (end == ptr) success = false;
					else if (*end != '-') success = false;
					else
					{
						ptr = end + 1;
						m_range_end = std::strtoll(ptr, &end, 10);
						if (m_range_end < 0
							|| m_range_end == std::numeric_limits<std::int64_t>::max())
						{
							m_state = error_state;
							error = true;
							return ret;
						}
						if (end == ptr) success = false;
					}

					if (!success || m_range_end < m_range_start)
					{
						m_state = error_state;
						error = true;
						return ret;
					}
					// the http range is inclusive
					m_content_length = m_range_end - m_range_start + 1;
				}
				else if (name == "transfer-encoding")
				{
					m_chunked_encoding = string_begins_no_case("chunked", value.c_str());
				}

				TORRENT_ASSERT(m_recv_pos <= int(recv_buffer.size()));
				TORRENT_ASSERT(pos <= recv_buffer.end());
				newline = std::find(pos, recv_buffer.end(), '\n');
			}
			std::get<1>(ret) += int(newline - (m_recv_buffer.data() + start_pos));
		}

		if (m_state == read_body)
		{
			int incoming = int(recv_buffer.end() - pos);

			if (m_chunked_encoding && (m_flags & dont_parse_chunks) == 0)
			{
				if (m_cur_chunk_end == -1)
					m_cur_chunk_end = m_body_start_pos;

				while (m_cur_chunk_end <= m_recv_pos + incoming && !m_finished && incoming > 0)
				{
					std::int64_t payload = m_cur_chunk_end - m_recv_pos;
					if (payload > 0)
					{
						TORRENT_ASSERT(payload < std::numeric_limits<int>::max());
						m_recv_pos += payload;
						std::get<0>(ret) += int(payload);
						incoming -= int(payload);
					}
					auto const buf = span<char const>(recv_buffer)
						.subspan(aux::numeric_cast<std::ptrdiff_t>(m_cur_chunk_end));
					std::int64_t chunk_size;
					int header_size;
					if (parse_chunk_header(buf, &chunk_size, &header_size))
					{
						if (chunk_size < 0
							|| chunk_size > std::numeric_limits<std::int64_t>::max() - m_cur_chunk_end - header_size)
						{
							m_state = error_state;
							error = true;
							return ret;
						}
						if (chunk_size > 0)
						{
							std::pair<std::int64_t, std::int64_t> chunk_range(m_cur_chunk_end + header_size
								, m_cur_chunk_end + header_size + chunk_size);
							m_chunked_ranges.push_back(chunk_range);
						}
						m_cur_chunk_end += header_size + chunk_size;
						if (chunk_size == 0)
						{
							m_finished = true;
						}
						header_size -= m_partial_chunk_header;
						m_partial_chunk_header = 0;
//						std::fprintf(stderr, "parse_chunk_header(%d, -> %" PRId64 ", -> %d) -> %d\n"
//							"  incoming = %d\n  m_recv_pos = %d\n  m_cur_chunk_end = %" PRId64 "\n"
//							"  content-length = %d\n"
//							, int(buf.size()), chunk_size, header_size, 1, incoming, int(m_recv_pos)
//							, m_cur_chunk_end, int(m_content_length));
					}
					else
					{
						m_partial_chunk_header += incoming;
						header_size = incoming;

//						std::fprintf(stderr, "parse_chunk_header(%d, -> %" PRId64 ", -> %d) -> %d\n"
//							"  incoming = %d\n  m_recv_pos = %d\n  m_cur_chunk_end = %" PRId64 "\n"
//							"  content-length = %d\n"
//							, int(buf.size()), chunk_size, header_size, 0, incoming, int(m_recv_pos)
//							, m_cur_chunk_end, int(m_content_length));
					}
					m_chunk_header_size += header_size;
					m_recv_pos += header_size;
					std::get<1>(ret) += header_size;
					incoming -= header_size;
				}
				if (incoming > 0)
				{
					m_recv_pos += incoming;
					std::get<0>(ret) += incoming;
//					incoming = 0;
				}
			}
			else
			{
				std::int64_t payload_received = m_recv_pos - m_body_start_pos + incoming;
				if (payload_received > m_content_length
					&& m_content_length >= 0)
				{
					TORRENT_ASSERT(m_content_length - m_recv_pos + m_body_start_pos
						< std::numeric_limits<int>::max());
					incoming = int(m_content_length - m_recv_pos + m_body_start_pos);
				}

				TORRENT_ASSERT(incoming >= 0);
				m_recv_pos += incoming;
				std::get<0>(ret) += incoming;
			}

			if (m_content_length >= 0
				&& !m_chunked_encoding
				&& m_recv_pos - m_body_start_pos >= m_content_length)
			{
				m_finished = true;
			}
		}
		return ret;
	}